

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::FileGenerator::Generate(FileGenerator *this,Printer *printer)

{
  __uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
  _Var1;
  __uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
  _Var2;
  Context *context;
  GeneratorFactory *pGVar3;
  int iVar4;
  FileDescriptor *pFVar5;
  long *plVar6;
  int i_4;
  long lVar7;
  int i;
  long lVar8;
  allocator local_89;
  int bytecode_estimate;
  int method_num;
  int static_block_bytecode_estimate;
  undefined4 extraout_var;
  
  io::Printer::Print<char[9],std::__cxx11::string>
            (printer,
             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
             ,(char (*) [9])"filename",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this->file_);
  if ((this->java_package_)._M_string_length != 0) {
    io::Printer::Print<char[8],std::__cxx11::string>
              (printer,"package $package$;\n\n",(char (*) [8])0x3aab82,&this->java_package_);
  }
  if ((this->options_).annotate_code == true) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &static_block_bytecode_estimate,&this->classname_,".java.pb.meta");
  }
  else {
    std::__cxx11::string::string((string *)&static_block_bytecode_estimate,"",&local_89);
  }
  PrintGeneratedAnnotation(printer,'$',(string *)&static_block_bytecode_estimate);
  std::__cxx11::string::~string((string *)&static_block_bytecode_estimate);
  _static_block_bytecode_estimate = "";
  if (*(char *)(*(long *)(this->file_ + 0x88) + 0x9f) != '\0') {
    _static_block_bytecode_estimate = "@java.lang.Deprecated ";
  }
  io::Printer::
  Print<char[12],char_const*,char[10],std::__cxx11::string,char[5],std::__cxx11::string>
            (printer,"$deprecation$public final class $classname$ {\n  private $ctor$() {}\n",
             (char (*) [12])"deprecation",(char **)&static_block_bytecode_estimate,
             (char (*) [10])0x3a498c,&this->classname_,(char (*) [5])0x399837,&this->classname_);
  io::Printer::Annotate(printer,"classname",*(string **)this->file_);
  io::Printer::Indent(printer);
  io::Printer::Print<>
            (printer,
             "public static void registerAllExtensions(\n    com.google.protobuf.ExtensionRegistryLite registry) {\n"
            );
  io::Printer::Indent(printer);
  lVar8 = 0;
  while( true ) {
    pFVar5 = this->file_;
    if (*(int *)(pFVar5 + 0x38) <= lVar8) break;
    _Var1._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>.
    _M_head_impl = (this->extension_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                   ._M_t;
    (**(code **)(*(long *)_Var1._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                          .
                          super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                          ._M_head_impl + 0x20))
              (_Var1._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
               ._M_head_impl,printer);
    lVar8 = lVar8 + 1;
  }
  for (lVar8 = 0; lVar8 < *(int *)(pFVar5 + 0x2c); lVar8 = lVar8 + 1) {
    _Var2._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>._M_head_impl
         = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
           ._M_t;
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                          .
                          super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                          ._M_head_impl + 0x30))
              (_Var2._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
               _M_head_impl,printer);
    pFVar5 = this->file_;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  if ((((this->context_)._M_t.
        super___uniq_ptr_impl<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::Context_*,_std::default_delete<google::protobuf::compiler::java::Context>_>
        .super__Head_base<0UL,_google::protobuf::compiler::java::Context_*,_false>._M_head_impl)->
      options_).enforce_lite == false) {
    io::Printer::Print<>
              (printer,
               "\npublic static void registerAllExtensions(\n    com.google.protobuf.ExtensionRegistry registry) {\n  registerAllExtensions(\n      (com.google.protobuf.ExtensionRegistryLite) registry);\n}\n"
              );
  }
  pFVar5 = this->file_;
  if (*(char *)(*(long *)(pFVar5 + 0x88) + 0x98) == '\0') {
    lVar8 = 0;
    for (lVar7 = 0; lVar7 < *(int *)(pFVar5 + 0x30); lVar7 = lVar7 + 1) {
      context = (this->context_)._M_t.
                super___uniq_ptr_impl<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
                ._M_t.
                super__Tuple_impl<0UL,_google::protobuf::compiler::java::Context_*,_std::default_delete<google::protobuf::compiler::java::Context>_>
                .super__Head_base<0UL,_google::protobuf::compiler::java::Context_*,_false>.
                _M_head_impl;
      if ((context->options_).enforce_lite == false) {
        EnumGenerator::EnumGenerator
                  ((EnumGenerator *)&static_block_bytecode_estimate,
                   (EnumDescriptor *)(*(long *)(pFVar5 + 0x70) + lVar8),this->immutable_api_,context
                  );
        EnumGenerator::Generate((EnumGenerator *)&static_block_bytecode_estimate,printer);
        EnumGenerator::~EnumGenerator((EnumGenerator *)&static_block_bytecode_estimate);
      }
      else {
        EnumLiteGenerator::EnumLiteGenerator
                  ((EnumLiteGenerator *)&static_block_bytecode_estimate,
                   (EnumDescriptor *)(*(long *)(pFVar5 + 0x70) + lVar8),this->immutable_api_,context
                  );
        EnumLiteGenerator::Generate((EnumLiteGenerator *)&static_block_bytecode_estimate,printer);
        EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)&static_block_bytecode_estimate);
      }
      pFVar5 = this->file_;
      lVar8 = lVar8 + 0x50;
    }
    for (lVar8 = 0; lVar8 < *(int *)(pFVar5 + 0x2c); lVar8 = lVar8 + 1) {
      _Var2._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
      _M_head_impl = (this->message_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                     ._M_t;
      (**(code **)(*(long *)_Var2._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                            ._M_head_impl + 0x28))
                (_Var2._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                 ._M_head_impl,printer);
      _Var2._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
      _M_head_impl = (this->message_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                     ._M_t;
      (**(code **)(*(long *)_Var2._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                            ._M_head_impl + 0x20))
                (_Var2._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                 ._M_head_impl,printer);
      pFVar5 = this->file_;
    }
    iVar4 = *(int *)(pFVar5 + 0x34);
    if (((0 < iVar4) &&
        ((((this->context_)._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::compiler::java::Context_*,_std::default_delete<google::protobuf::compiler::java::Context>_>
           .super__Head_base<0UL,_google::protobuf::compiler::java::Context_*,_false>._M_head_impl)
         ->options_).enforce_lite == false)) &&
       (*(char *)(*(long *)(pFVar5 + 0x88) + 0x9c) == '\x01')) {
      lVar8 = 0;
      for (lVar7 = 0; lVar7 < iVar4; lVar7 = lVar7 + 1) {
        pGVar3 = (this->generator_factory_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_false>
                 ._M_head_impl;
        iVar4 = (*pGVar3->_vptr_GeneratorFactory[4])(pGVar3,*(long *)(pFVar5 + 0x78) + lVar8);
        plVar6 = (long *)CONCAT44(extraout_var,iVar4);
        (**(code **)(*plVar6 + 0x10))(plVar6,printer);
        (**(code **)(*plVar6 + 8))(plVar6);
        pFVar5 = this->file_;
        iVar4 = *(int *)(pFVar5 + 0x34);
        lVar8 = lVar8 + 0x30;
      }
    }
  }
  for (lVar8 = 0; lVar8 < *(int *)(pFVar5 + 0x38); lVar8 = lVar8 + 1) {
    _Var1._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>.
    _M_head_impl = (this->extension_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                   ._M_t;
    (**(code **)(*(long *)_Var1._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                          .
                          super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                          ._M_head_impl + 0x10))
              (_Var1._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
               ._M_head_impl,printer);
    pFVar5 = this->file_;
  }
  _static_block_bytecode_estimate =
       (char *)((ulong)_static_block_bytecode_estimate & 0xffffffff00000000);
  for (lVar8 = 0; lVar8 < *(int *)(pFVar5 + 0x2c); lVar8 = lVar8 + 1) {
    _Var2._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>._M_head_impl
         = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
           ._M_t;
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                          .
                          super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                          ._M_head_impl + 0x10))
              (_Var2._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
               _M_head_impl,printer,&static_block_bytecode_estimate);
    pFVar5 = this->file_;
  }
  io::Printer::Print<>(printer,"\n");
  if ((((this->context_)._M_t.
        super___uniq_ptr_impl<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::Context_*,_std::default_delete<google::protobuf::compiler::java::Context>_>
        .super__Head_base<0UL,_google::protobuf::compiler::java::Context_*,_false>._M_head_impl)->
      options_).enforce_lite == false) {
    if (this->immutable_api_ == true) {
      GenerateDescriptorInitializationCodeForImmutable(this,printer);
    }
    else {
      GenerateDescriptorInitializationCodeForMutable(this,printer);
    }
  }
  else {
    io::Printer::Print<>(printer,"static {\n");
    io::Printer::Indent(printer);
    bytecode_estimate = 0;
    method_num = 0;
    for (lVar8 = 0; lVar8 < *(int *)(this->file_ + 0x2c); lVar8 = lVar8 + 1) {
      _Var2._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
      _M_head_impl = (this->message_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                     ._M_t;
      iVar4 = (**(code **)(*(long *)_Var2._M_t.
                                    super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                                    .
                                    super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                                    ._M_head_impl + 0x18))
                        (_Var2._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                         .
                         super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                         ._M_head_impl,printer);
      bytecode_estimate = bytecode_estimate + iVar4;
      anon_unknown_0::MaybeRestartJavaMethod
                (printer,&bytecode_estimate,&method_num,"_clinit_autosplit_$method_num$();\n",
                 "private static void _clinit_autosplit_$method_num$() {\n");
    }
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"}\n");
  }
  io::Printer::Print<>(printer,"\n// @@protoc_insertion_point(outer_class_scope)\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void FileGenerator::Generate(io::Printer* printer) {
  // We don't import anything because we refer to all classes by their
  // fully-qualified names in the generated source.
  printer->Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// source: $filename$\n"
      "\n",
      "filename", file_->name());
  if (!java_package_.empty()) {
    printer->Print(
        "package $package$;\n"
        "\n",
        "package", java_package_);
  }
  PrintGeneratedAnnotation(
      printer, '$', options_.annotate_code ? classname_ + ".java.pb.meta" : "");
  printer->Print(
      "$deprecation$public final class $classname$ {\n"
      "  private $ctor$() {}\n",
      "deprecation",
      file_->options().deprecated() ? "@java.lang.Deprecated " : "",
      "classname", classname_, "ctor", classname_);
  printer->Annotate("classname", file_->name());
  printer->Indent();

  // -----------------------------------------------------------------

  printer->Print(
      "public static void registerAllExtensions(\n"
      "    com.google.protobuf.ExtensionRegistryLite registry) {\n");

  printer->Indent();

  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateExtensionRegistrationCode(printer);
  }

  printer->Outdent();
  printer->Print("}\n");
  if (HasDescriptorMethods(file_, context_->EnforceLite())) {
    // Overload registerAllExtensions for the non-lite usage to
    // redundantly maintain the original signature (this is
    // redundant because ExtensionRegistryLite now invokes
    // ExtensionRegistry in the non-lite usage). Intent is
    // to remove this in the future.
    printer->Print(
        "\n"
        "public static void registerAllExtensions(\n"
        "    com.google.protobuf.ExtensionRegistry registry) {\n"
        "  registerAllExtensions(\n"
        "      (com.google.protobuf.ExtensionRegistryLite) registry);\n"
        "}\n");
  }

  // -----------------------------------------------------------------

  if (!MultipleJavaFiles(file_, immutable_api_)) {
    for (int i = 0; i < file_->enum_type_count(); i++) {
      if (HasDescriptorMethods(file_, context_->EnforceLite())) {
        EnumGenerator(file_->enum_type(i), immutable_api_, context_.get())
            .Generate(printer);
      } else {
        EnumLiteGenerator(file_->enum_type(i), immutable_api_, context_.get())
            .Generate(printer);
      }
    }
    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateInterface(printer);
      message_generators_[i]->Generate(printer);
    }
    if (HasGenericServices(file_, context_->EnforceLite())) {
      for (int i = 0; i < file_->service_count(); i++) {
        std::unique_ptr<ServiceGenerator> generator(
            generator_factory_->NewServiceGenerator(file_->service(i)));
        generator->Generate(printer);
      }
    }
  }

  // Extensions must be generated in the outer class since they are values,
  // not classes.
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->Generate(printer);
  }

  // Static variables. We'd like them to be final if possible, but due to
  // the JVM's 64k size limit on static blocks, we have to initialize some
  // of them in methods; thus they cannot be final.
  int static_block_bytecode_estimate = 0;
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateStaticVariables(
        printer, &static_block_bytecode_estimate);
  }

  printer->Print("\n");

  if (HasDescriptorMethods(file_, context_->EnforceLite())) {
    if (immutable_api_) {
      GenerateDescriptorInitializationCodeForImmutable(printer);
    } else {
      GenerateDescriptorInitializationCodeForMutable(printer);
    }
  } else {
    printer->Print("static {\n");
    printer->Indent();
    int bytecode_estimate = 0;
    int method_num = 0;

    for (int i = 0; i < file_->message_type_count(); i++) {
      bytecode_estimate +=
          message_generators_[i]->GenerateStaticVariableInitializers(printer);
      MaybeRestartJavaMethod(
          printer, &bytecode_estimate, &method_num,
          "_clinit_autosplit_$method_num$();\n",
          "private static void _clinit_autosplit_$method_num$() {\n");
    }

    printer->Outdent();
    printer->Print("}\n");
  }

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(outer_class_scope)\n");

  printer->Outdent();
  printer->Print("}\n");
}